

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs)

{
  char32_t cVar1;
  int iVar2;
  qsizetype qVar3;
  anon_unknown_dwarf_bb6601 *paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  anon_unknown_dwarf_bb6601 *paVar8;
  char16_t *ch;
  anon_unknown_dwarf_bb6601 *this;
  char16_t *pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char16_t *ch_00;
  bool bVar13;
  QStringView haystack_00;
  QStringView rhs;
  QStringView lhs;
  long local_58;
  
  haystack_00.m_size = haystack.m_data;
  this = (anon_unknown_dwarf_bb6601 *)haystack.m_size;
  pcVar9 = needle.m_data;
  uVar6 = needle.m_size;
  if (uVar6 == 1) {
    haystack_00.m_data._0_2_ = *pcVar9;
    haystack_00.m_data._2_6_ = 0;
    qVar3 = anon_unknown.dwarf_bb6601::qLastIndexOf<QStringView>
                      (this,haystack_00,(QChar)(char16_t)from,(ulong)cs,cs);
    return qVar3;
  }
  paVar4 = (anon_unknown_dwarf_bb6601 *)((from >> 0x3f & (ulong)this) + from);
  if (paVar4 != this || uVar6 != 0) {
    paVar8 = this + -uVar6;
    bVar13 = paVar4 <= this;
    this = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    if (-1 < (long)paVar8 && bVar13) {
      if ((long)paVar4 < (long)paVar8) {
        paVar8 = paVar4;
      }
      uVar7 = uVar6 - 1;
      if (uVar6 == 0) {
        uVar7 = 0;
      }
      ch = pcVar9 + uVar7;
      ch_00 = haystack_00.m_size + (long)paVar8 + uVar7;
      uVar10 = 0;
      if (0 < (long)uVar6) {
        uVar10 = uVar6;
      }
      if (cs == CaseSensitive) {
        lVar11 = 0;
        lVar12 = 0;
        for (lVar5 = 0; -lVar5 != uVar10; lVar5 = lVar5 + -1) {
          lVar12 = (ulong)(ushort)ch[lVar5] + lVar12 * 2;
          lVar11 = (ulong)(ushort)ch_00[lVar5] + lVar11 * 2;
        }
        lVar11 = lVar11 - (ulong)(ushort)haystack_00.m_size[(long)paVar8];
        for (lVar5 = (long)paVar8 * 2; pcVar9 = (char16_t *)((long)haystack_00.m_size + lVar5),
            haystack_00.m_size <= pcVar9; lVar5 = lVar5 + -2) {
          lVar11 = lVar11 + (ulong)(ushort)*pcVar9;
          if ((lVar11 == lVar12) &&
             (rhs.m_data = pcVar9, rhs.m_size = uVar6,
             iVar2 = compareStrings(needle,rhs,CaseSensitive), iVar2 == 0)) {
LAB_002f17ac:
            return lVar5 >> 1;
          }
          if (uVar7 < 0x40) {
            lVar11 = lVar11 - ((ulong)*(ushort *)((long)haystack_00.m_size + lVar5 + uVar6 * 2 + -2)
                              << ((byte)uVar7 & 0x3f));
          }
          lVar11 = lVar11 * 2;
        }
      }
      else {
        lVar12 = 0;
        local_58 = 0;
        while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
          cVar1 = foldCase(ch,pcVar9);
          local_58 = (ulong)(uint)cVar1 + local_58 * 2;
          cVar1 = foldCase(ch_00,haystack_00.m_size);
          lVar12 = (ulong)(uint)cVar1 + lVar12 * 2;
          ch_00 = ch_00 + -1;
          ch = ch + -1;
        }
        cVar1 = foldCase(haystack_00.m_size + (long)paVar8,haystack_00.m_size);
        lVar12 = lVar12 - (ulong)(uint)cVar1;
        for (lVar5 = (long)paVar8 * 2; pcVar9 = (char16_t *)(lVar5 + (long)haystack_00.m_size),
            haystack_00.m_size <= pcVar9; lVar5 = lVar5 + -2) {
          cVar1 = foldCase(pcVar9,haystack_00.m_size);
          lVar12 = lVar12 + (ulong)(uint)cVar1;
          if ((lVar12 == local_58) &&
             (lhs.m_data = pcVar9, lhs.m_size = uVar6,
             iVar2 = compareStrings(lhs,needle,CaseInsensitive), iVar2 == 0)) goto LAB_002f17ac;
          if (uVar7 < 0x40) {
            cVar1 = foldCase((char16_t *)((long)haystack_00.m_size + lVar5 + uVar6 * 2 + -2),
                             haystack_00.m_size);
            lVar12 = lVar12 - ((ulong)(uint)cVar1 << ((byte)uVar7 & 0x3f));
          }
          lVar12 = lVar12 * 2;
        }
      }
      this = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    }
  }
  return (qsizetype)this;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}